

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (void *param_1,undefined8 param_2)

{
  long lVar1;
  void **elems;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffe0;
  
  if ((*(long *)((long)param_1 + 0x10) == 0) ||
     (*(int *)((long)param_1 + 0xc) <= **(int **)((long)param_1 + 0x10))) {
    UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              (in_stack_ffffffffffffffe0,(Type *)param_1);
  }
  else {
    lVar1 = *(long *)((long)param_1 + 0x10) + 8;
    if (*(int *)((long)param_1 + 8) < **(int **)((long)param_1 + 0x10)) {
      *(undefined8 *)(lVar1 + (long)**(int **)((long)param_1 + 0x10) * 8) =
           *(undefined8 *)(lVar1 + (long)*(int *)((long)param_1 + 8) * 8);
    }
    *(undefined8 *)(lVar1 + (long)*(int *)((long)param_1 + 8) * 8) = param_2;
    *(int *)((long)param_1 + 8) = *(int *)((long)param_1 + 8) + 1;
    **(int **)((long)param_1 + 0x10) = **(int **)((long)param_1 + 0x10) + 1;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedInternal(
    typename TypeHandler::Type* value, std::false_type) {
  if (rep_ && rep_->allocated_size < total_size_) {
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at least
    // one slot that is not allocated).
    void** elems = rep_->elements;
    if (current_size_ < rep_->allocated_size) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[rep_->allocated_size] = elems[current_size_];
    }
    elems[current_size_] = value;
    current_size_ = current_size_ + 1;
    ++rep_->allocated_size;
  } else {
    UnsafeArenaAddAllocated<TypeHandler>(value);
  }
}